

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_23da7e::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  int iVar1;
  int scanLine2;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 in_RAX;
  half *phVar6;
  half *phVar7;
  Header *pHVar8;
  Box2i *pBVar9;
  half *b;
  ulong uVar10;
  int pNbChannels;
  size_t yst;
  undefined1 in_R10B;
  long lVar11;
  ulong uVar12;
  half *b_00;
  long lVar13;
  int pWidth_local;
  int pHeight_local;
  undefined8 local_110;
  Array2D<half> lPixelsLeft;
  Array2D<half> lPixels;
  InputFile lFile;
  FrameBuffer lInputFrameBuffer;
  Slice local_68;
  
  if (pImageType == IMAGE_TYPE_RGB) {
    pNbChannels = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      pNbChannels = 2;
      local_110 = CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)in_RAX >> 8),1));
      goto LAB_0018095c;
    }
    pNbChannels = 4;
  }
  local_110 = (ulong)local_110._4_4_ << 0x20;
LAB_0018095c:
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  lVar13 = (long)pHeight;
  lVar11 = (long)(pWidth * pNbChannels);
  uVar10 = 0xffffffffffffffff;
  if (-1 < lVar11 * lVar13) {
    uVar10 = lVar11 * lVar13 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  phVar6 = (half *)operator_new__(uVar10);
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  lPixels._sizeX = lVar13;
  lPixels._sizeY = lVar11;
  lPixels._data = phVar6;
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    phVar7 = (half *)operator_new__(uVar10);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
    lPixelsLeft._sizeX = lVar13;
    lPixelsLeft._sizeY = lVar11;
    lPixelsLeft._data = phVar7;
    iVar5 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile(&lFile,pFilename,iVar5);
    pHVar8 = Imf_2_5::InputFile::header(&lFile);
    pBVar9 = Imf_2_5::Header::dataWindow(pHVar8);
    iVar5 = (pBVar9->min).y;
    iVar1 = (pBVar9->max).y;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar10 = (ulong)(uint)(pNbChannels * 2);
    yst = (long)(((pBVar9->max).x - (pBVar9->min).x) + 1) * uVar10;
    local_110 = (ulong)(uint)(pNbChannels * 8);
    uVar12 = 0;
    b = phVar7;
    b_00 = phVar6;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar3 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar12);
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)b_00,uVar10,yst,1,1,
                 (double)*(float *)((long)&half::_toFloat +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),
                 (bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar3,&local_68);
      pcVar3 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + uVar12);
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)b,uVar10,yst,1,1,
                 (double)*(float *)((long)&half::_toFloat +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),
                 (bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar3,&local_68);
      uVar12 = uVar12 + 8;
      b = b + 1;
      b_00 = b_00 + 1;
    } while (local_110 != uVar12);
    Imf_2_5::InputFile::setFrameBuffer(&lFile,&lInputFrameBuffer);
    Imf_2_5::InputFile::readPixels(&lFile,iVar5,iVar1);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_2_5::InputFile::~InputFile(&lFile);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
    validatePixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    operator_delete__(phVar7);
  }
  else {
    iVar5 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile((InputFile *)&lPixelsLeft,pFilename,iVar5);
    pHVar8 = Imf_2_5::InputFile::header((InputFile *)&lPixelsLeft);
    pBVar9 = Imf_2_5::Header::dataWindow(pHVar8);
    iVar5 = (pBVar9->min).y;
    iVar1 = (pBVar9->max).x;
    scanLine2 = (pBVar9->max).y;
    iVar2 = (pBVar9->min).x;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar10 = 0;
    phVar7 = phVar6;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar3 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar10);
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)phVar7,(ulong)(uint)(pNbChannels * 2),
                 (long)((iVar1 - iVar2) + 1) * (ulong)(uint)(pNbChannels * 2),1,1,
                 (double)*(float *)((long)&half::_toFloat +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),
                 (bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar3,&local_68);
      uVar10 = uVar10 + 8;
      phVar7 = phVar7 + 1;
    } while ((uint)(pNbChannels * 8) != uVar10);
    Imf_2_5::InputFile::setFrameBuffer((InputFile *)&lPixelsLeft,&lInputFrameBuffer);
    bVar4 = Imf_2_5::InputFile::isOptimizationEnabled((InputFile *)&lPixelsLeft);
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization enabled\n",0x16);
      if ((char)local_110 != '\0') {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels!=2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testOptimized.cpp"
                      ,0x161,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization disabled\n",0x17);
    }
    Imf_2_5::InputFile::readPixels((InputFile *)&lPixelsLeft,iVar5,scanLine2);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_2_5::InputFile::~InputFile((InputFile *)&lPixelsLeft);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  }
  operator_delete__(phVar6);
  return;
}

Assistant:

void
readValidateFile (const char pFilename[],
                  int pHeight,
                  int pWidth,
                  EImageType
                  pImageType,
                  bool pIsStereo)
{
    const int lNbChannels = getNbChannels(pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase(pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);


    if(pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}